

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleReadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  bool bVar1;
  int iVar2;
  _Ios_Seekdir _Var3;
  long *plVar4;
  long sizeLimit;
  char c;
  cmCommand *local_5b8;
  undefined4 local_5ac;
  string output;
  cmCommandArgumentsHelper argHelper;
  char hex [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_558;
  cmCommandArgumentGroup group;
  string fileName;
  string variable;
  cmCAString resultArg;
  cmCAString fileNameArg;
  cmCAString readArg;
  cmCAEnabler hexOutputArg;
  cmCAString limitArg;
  cmCAString offsetArg;
  ifstream file;
  byte abStack_218 [488];
  
  local_5b8 = &this->super_cmCommand;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x41) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&file,"READ must be called with at least two additional arguments",
               (allocator<char> *)&readArg);
    cmCommand::SetError(local_5b8,(string *)&file);
    std::__cxx11::string::~string((string *)&file);
    local_5ac = 0;
  }
  else {
    argHelper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    argHelper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    argHelper.Arguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    group.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    group.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    group.ContainedArguments.
    super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmCAString::cmCAString(&readArg,&argHelper,"READ",(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&fileNameArg,&argHelper,(char *)0x0,(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&resultArg,&argHelper,(char *)0x0,(cmCommandArgumentGroup *)0x0);
    cmCAString::cmCAString(&offsetArg,&argHelper,"OFFSET",&group);
    cmCAString::cmCAString(&limitArg,&argHelper,"LIMIT",&group);
    cmCAEnabler::cmCAEnabler(&hexOutputArg,&argHelper,"HEX",&group);
    cmCommandArgument::Follows(&readArg.super_cmCommandArgument,(cmCommandArgument *)0x0);
    cmCommandArgument::Follows
              (&fileNameArg.super_cmCommandArgument,&readArg.super_cmCommandArgument);
    cmCommandArgument::Follows
              (&resultArg.super_cmCommandArgument,&fileNameArg.super_cmCommandArgument);
    cmCommandArgumentGroup::Follows(&group,&resultArg.super_cmCommandArgument);
    cmCommandArgumentsHelper::Parse
              (&argHelper,args,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0);
    std::__cxx11::string::string((string *)&fileName,(string *)&fileNameArg.String);
    bVar1 = cmsys::SystemTools::FileIsFullPath(&fileName);
    if (!bVar1) {
      cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_5b8->Makefile);
      std::__cxx11::string::_M_assign((string *)&fileName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,"/",
                     &fileNameArg.String);
      std::__cxx11::string::append((string *)&fileName);
      std::__cxx11::string::~string((string *)&file);
    }
    std::__cxx11::string::string((string *)&variable,(string *)&resultArg.String);
    std::ifstream::ifstream(&file,fileName._M_dataplus._M_p,_S_in);
    bVar1 = (abStack_218[*(long *)(_file + -0x18)] & 5) == 0;
    local_5ac = (undefined4)CONCAT71((int7)((ulong)*(long *)(_file + -0x18) >> 8),bVar1);
    if (bVar1) {
      if (limitArg.String._M_string_length == 0) {
        sizeLimit = -1;
      }
      else {
        iVar2 = atoi(limitArg.String._M_dataplus._M_p);
        sizeLimit = (long)iVar2;
      }
      if (offsetArg.String._M_string_length == 0) {
        _Var3 = _S_beg;
      }
      else {
        _Var3 = atoi(offsetArg.String._M_dataplus._M_p);
      }
      std::istream::seekg((long)&file,_Var3);
      output._M_dataplus._M_p = (pointer)&output.field_2;
      output._M_string_length = 0;
      output.field_2._M_local_buf[0] = '\0';
      if (hexOutputArg.Enabled == true) {
        for (; sizeLimit != 0; sizeLimit = sizeLimit - (ulong)(0 < sizeLimit)) {
          plVar4 = (long *)std::istream::get((char *)&file);
          if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
          sprintf(hex,"%.2x",(ulong)(byte)c);
          std::__cxx11::string::append((char *)&output);
        }
      }
      else {
        _hex = (pointer)&local_558;
        local_558._M_local_buf[0] = '\0';
        c = '\0';
        while (sizeLimit != 0) {
          bVar1 = cmsys::SystemTools::GetLineFromStream
                            ((istream *)&file,(string *)hex,(bool *)&c,sizeLimit);
          if (!bVar1) break;
          if ((0 < sizeLimit) && (sizeLimit = sizeLimit - (ulong)(byte)c, sizeLimit < 1)) {
            sizeLimit = 0;
          }
          std::__cxx11::string::append((string *)&output);
          if (c == '\x01') {
            std::__cxx11::string::append((char *)&output);
          }
        }
        std::__cxx11::string::~string((string *)hex);
      }
      cmMakefile::AddDefinition(local_5b8->Makefile,&variable,output._M_dataplus._M_p);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&output,"failed to open for reading (",(allocator<char> *)hex);
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      std::__cxx11::string::append((string *)&output);
      std::__cxx11::string::~string((string *)hex);
      std::__cxx11::string::append((char *)&output);
      std::__cxx11::string::append((string *)&output);
      cmCommand::SetError(local_5b8,&output);
    }
    std::__cxx11::string::~string((string *)&output);
    std::ifstream::~ifstream(&file);
    std::__cxx11::string::~string((string *)&variable);
    std::__cxx11::string::~string((string *)&fileName);
    cmCommandArgument::~cmCommandArgument(&hexOutputArg.super_cmCommandArgument);
    cmCAString::~cmCAString(&limitArg);
    cmCAString::~cmCAString(&offsetArg);
    cmCAString::~cmCAString(&resultArg);
    cmCAString::~cmCAString(&fileNameArg);
    cmCAString::~cmCAString(&readArg);
    std::_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::~_Vector_base
              ((_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *)&group);
    std::_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>::~_Vector_base
              ((_Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_> *)&argHelper
              );
  }
  return SUB41(local_5ac,0);
}

Assistant:

bool cmFileCommand::HandleReadCommand(std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("READ must be called with at least two additional "
                   "arguments");
    return false;
  }

  cmCommandArgumentsHelper argHelper;
  cmCommandArgumentGroup group;

  cmCAString readArg(&argHelper, "READ");
  cmCAString fileNameArg(&argHelper, nullptr);
  cmCAString resultArg(&argHelper, nullptr);

  cmCAString offsetArg(&argHelper, "OFFSET", &group);
  cmCAString limitArg(&argHelper, "LIMIT", &group);
  cmCAEnabler hexOutputArg(&argHelper, "HEX", &group);
  readArg.Follows(nullptr);
  fileNameArg.Follows(&readArg);
  resultArg.Follows(&fileNameArg);
  group.Follows(&resultArg);
  argHelper.Parse(&args, nullptr);

  std::string fileName = fileNameArg.GetString();
  if (!cmsys::SystemTools::FileIsFullPath(fileName)) {
    fileName = this->Makefile->GetCurrentSourceDirectory();
    fileName += "/" + fileNameArg.GetString();
  }

  std::string variable = resultArg.GetString();

// Open the specified file.
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream file(
    fileName.c_str(),
    std::ios::in |
      (hexOutputArg.IsEnabled() ? std::ios::binary : std::ios::in));
#else
  cmsys::ifstream file(fileName.c_str());
#endif

  if (!file) {
    std::string error = "failed to open for reading (";
    error += cmSystemTools::GetLastSystemError();
    error += "):\n  ";
    error += fileName;
    this->SetError(error);
    return false;
  }

  // is there a limit?
  long sizeLimit = -1;
  if (!limitArg.GetString().empty()) {
    sizeLimit = atoi(limitArg.GetCString());
  }

  // is there an offset?
  long offset = 0;
  if (!offsetArg.GetString().empty()) {
    offset = atoi(offsetArg.GetCString());
  }

  file.seekg(offset, std::ios::beg); // explicit ios::beg for IBM VisualAge 6

  std::string output;

  if (hexOutputArg.IsEnabled()) {
    // Convert part of the file into hex code
    char c;
    while ((sizeLimit != 0) && (file.get(c))) {
      char hex[4];
      sprintf(hex, "%.2x", c & 0xff);
      output += hex;
      if (sizeLimit > 0) {
        sizeLimit--;
      }
    }
  } else {
    std::string line;
    bool has_newline = false;
    while (
      sizeLimit != 0 &&
      cmSystemTools::GetLineFromStream(file, line, &has_newline, sizeLimit)) {
      if (sizeLimit > 0) {
        sizeLimit = sizeLimit - static_cast<long>(line.size());
        if (has_newline) {
          sizeLimit--;
        }
        if (sizeLimit < 0) {
          sizeLimit = 0;
        }
      }
      output += line;
      if (has_newline) {
        output += "\n";
      }
    }
  }
  this->Makefile->AddDefinition(variable, output.c_str());
  return true;
}